

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_jpg(char *filename,int x,int y,int comp,void *data,int quality)

{
  int iVar1;
  undefined1 local_48 [4];
  int r;
  stbi__write_context s;
  int quality_local;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  s.context._4_4_ = quality;
  iVar1 = stbi__start_write_file((stbi__write_context *)local_48,filename);
  if (iVar1 == 0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ =
         stbi_write_jpg_core((stbi__write_context *)local_48,x,y,comp,data,s.context._4_4_);
    stbi__end_write_file((stbi__write_context *)local_48);
  }
  return filename_local._4_4_;
}

Assistant:

STBIWDEF int stbi_write_jpg(char const *filename, int x, int y, int comp, const void *data, int quality)
{
   stbi__write_context s;
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_jpg_core(&s, x, y, comp, data, quality);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}